

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hvtool.cpp
# Opt level: O0

void __thiscall ent::roots::roots(roots *this,uint32_t id,ByteVector *data)

{
  bool bVar1;
  reference buf;
  undefined8 uVar2;
  string local_80;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_60 [2];
  uint *local_50;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_48;
  uint *local_40;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_38;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> i;
  ByteVector *data_local;
  uint32_t id_local;
  roots *this_local;
  
  ent::base::base(&this->super_base,id,data);
  (this->super_base).super_MemoryReader.super_ReadWriter._vptr_ReadWriter =
       (_func_int **)&PTR__roots_00189e90;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->_roots);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->_lasts);
  vectorread32le<ent::roots*>(this,&this->_roots,8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->_lasts,8);
  local_48._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->_roots);
  local_40 = (uint *)__gnu_cxx::
                     __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                     ::operator+(&local_48,3);
  local_50 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&this->_roots);
  local_38 = std::
             find_if<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,ent::roots::roots(unsigned_int,std::vector<unsigned_char,std::allocator<unsigned_char>>const&)::_lambda(unsigned_int)_1_>
                       (local_40,local_50);
  local_60[0]._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&this->_roots);
  bVar1 = __gnu_cxx::operator!=(&local_38,local_60);
  if (bVar1) {
    buf = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&this->_roots,3);
    hexdump<unsigned_int*>(&local_80,buf,5,1,ET_LITTLEENDIAN);
    uVar2 = std::__cxx11::string::c_str();
    printf("WARNING: more roots: %s\n",uVar2);
    std::__cxx11::string::~string((string *)&local_80);
  }
  return;
}

Assistant:

roots(uint32_t id, const ByteVector& data)
        : base(id, data)
    {
        vectorread32le(this, _roots, 8);
        _lasts.resize(8); // note: not updated
        auto i= std::find_if(_roots.begin()+3, _roots.end(), [](uint32_t x) { return x!=0; });
        if (i!=_roots.end())
            printf("WARNING: more roots: %s\n", hexdump(&_roots[3], 5).c_str());

    }